

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCopyPixels.cpp
# Opt level: O2

void testTiledCopyPixels(string *tempDir)

{
  int in_EAX;
  ostream *poVar1;
  int in_ECX;
  int in_R8D;
  int in_R9D;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing fast pixel copying for tiled files");
  std::endl<char,std::char_traits<char>>(poVar1);
  anon_unknown.dwarf_291327::writeCopyRead(tempDir,0,0,in_ECX,in_R8D,in_R9D,in_EAX);
  anon_unknown.dwarf_291327::writeCopyRead(tempDir,0,0x1d,in_ECX,in_R8D,in_R9D,in_EAX);
  anon_unknown.dwarf_291327::writeCopyRead(tempDir,0x11,0,in_ECX,in_R8D,in_R9D,in_EAX);
  anon_unknown.dwarf_291327::writeCopyRead(tempDir,0x11,0x1d,in_ECX,in_R8D,in_R9D,in_EAX);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void
testTiledCopyPixels (const std::string& tempDir)
{
    try
    {
        cout << "Testing fast pixel copying for tiled files" << endl;

        const int W  = 171;
        const int H  = 259;
        const int DX = 17;
        const int DY = 29;
        const int YS = 55;

        writeCopyRead (tempDir, W, H, DX, YS, 0, 0);
        writeCopyRead (tempDir, W, H, DX, YS, 0, DY);
        writeCopyRead (tempDir, W, H, DX, YS, DX, 0);
        writeCopyRead (tempDir, W, H, DX, YS, DX, DY);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}